

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Value * __thiscall
soul::heart::BinaryOperator::getAsConstant(Value *__return_storage_ptr__,BinaryOperator *this)

{
  bool bVar1;
  Expression *pEVar2;
  anon_class_8_1_8991fb9c local_f0;
  Value local_e8;
  undefined1 local_a8 [8];
  Value b;
  undefined1 local_58 [8];
  Value a;
  BinaryOperator *this_local;
  
  a.allocatedData.allocatedData.space[0] = (uint64_t)this;
  pEVar2 = pool_ref<soul::heart::Expression>::operator->(&this->lhs);
  (*(pEVar2->super_Object)._vptr_Object[7])();
  bVar1 = soul::Value::isValid((Value *)local_58);
  if (bVar1) {
    pEVar2 = pool_ref<soul::heart::Expression>::operator->(&this->rhs);
    (*(pEVar2->super_Object)._vptr_Object[7])(local_a8);
    bVar1 = soul::Value::isValid((Value *)local_a8);
    if (bVar1) {
      soul::Value::Value(&local_e8,(Value *)local_a8);
      local_f0.this = this;
      bVar1 = BinaryOp::
              apply<soul::heart::BinaryOperator::getAsConstant()const::_lambda(soul::CompileMessage)_1_>
                        ((Value *)local_58,&local_e8,this->operation,&local_f0);
      soul::Value::~Value(&local_e8);
      if (!bVar1) goto LAB_00414660;
      soul::Value::Value(__return_storage_ptr__,(Value *)local_58);
      bVar1 = true;
    }
    else {
LAB_00414660:
      bVar1 = false;
    }
    soul::Value::~Value((Value *)local_a8);
    if (bVar1) goto LAB_004146aa;
  }
  soul::Value::Value(__return_storage_ptr__);
LAB_004146aa:
  soul::Value::~Value((Value *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto a = lhs->getAsConstant();

            if (a.isValid())
            {
                auto b = rhs->getAsConstant();

                if (b.isValid())
                    if (BinaryOp::apply (a, b, operation,
                                         [this] (CompileMessage message) { location.throwError (message); }))
                        return a;
            }

            return {};
        }